

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::VariableDatum::GetDatumValueCopyIntoBuffer
          (VariableDatum *this,KOCTET *Buffer,KUINT16 BufferSize)

{
  ulong uVar1;
  uint uVar2;
  KException *this_00;
  pointer pDVar3;
  undefined6 in_register_00000012;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  allocator<char> local_39;
  KString local_38;
  
  dVar6 = ceil((double)this->m_ui32DatumLength * 0.125);
  uVar2 = (uint)(long)dVar6;
  if (uVar2 <= (uint)CONCAT62(in_register_00000012,BufferSize)) {
    pDVar3 = (this->m_v8DatumValue).
             super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar4 = 0; (ushort)uVar4 < (ushort)(long)dVar6;
        uVar4 = (ulong)(uint)((int)uVar5 + (int)uVar4)) {
      for (uVar5 = 0;
          (uVar1 = (uVar4 & 0xffff) + uVar5, ((uint)uVar1 & 0xffff) < uVar2 && (uVar5 < 8));
          uVar5 = uVar5 + 1) {
        Buffer[uVar1 & 0xffff] = pDVar3->Buffer[uVar5];
      }
      pDVar3 = pDVar3 + 1;
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"GetDatumValueCopyIntoBuffer",&local_39);
  KException::KException(this_00,&local_38,1);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void VariableDatum::GetDatumValueCopyIntoBuffer(KOCTET *Buffer, KUINT16 BufferSize) const noexcept(false)
{
    KUINT32 sizeInOctets = ceil( m_ui32DatumLength / 8.0 );

    if( BufferSize < sizeInOctets )throw KException( __FUNCTION__, BUFFER_TOO_SMALL );

    // Copy the data into the buffer, octet by octet
    vector<DatumEntry>::const_iterator citr = m_v8DatumValue.begin();

    KUINT16 i = 0;

    while( i < sizeInOctets )
    {
        for( KUINT16 j = 0; i < sizeInOctets && j < 8; ++j, ++i )
        {
            Buffer[i] = citr->Buffer[j];
        }
        ++citr;
    }
}